

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapFields
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  FieldDescriptor *field;
  long lVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int oneof_index;
  Message *local_80;
  GeneratedMessageReflection *local_78;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_70;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  
  if (message1 != message2) {
    local_80 = message2;
    local_70 = fields;
    iVar2 = (*(message1->super_MessageLite)._vptr_MessageLite[0x16])(message1);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar2) != this) {
      LogMessage::LogMessage
                ((LogMessage *)&swapped_oneof,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x29d);
      pLVar5 = LogMessage::operator<<
                         ((LogMessage *)&swapped_oneof,
                          "CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar5 = LogMessage::operator<<(pLVar5,"First argument to SwapFields() (of type \"");
      iVar2 = (*(message1->super_MessageLite)._vptr_MessageLite[0x17])(message1);
      pLVar5 = LogMessage::operator<<(pLVar5,*(string **)(CONCAT44(extraout_var_00,iVar2) + 8));
      pLVar5 = LogMessage::operator<<
                         (pLVar5,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar5 = LogMessage::operator<<(pLVar5,*(string **)(this->descriptor_ + 8));
      pLVar5 = LogMessage::operator<<
                         (pLVar5,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&oneof_index,pLVar5);
      LogMessage::~LogMessage((LogMessage *)&swapped_oneof);
    }
    iVar2 = (*(local_80->super_MessageLite)._vptr_MessageLite[0x16])();
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_01,iVar2) != this) {
      LogMessage::LogMessage
                ((LogMessage *)&swapped_oneof,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2a4);
      pLVar5 = LogMessage::operator<<
                         ((LogMessage *)&swapped_oneof,
                          "CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar5 = LogMessage::operator<<(pLVar5,"Second argument to SwapFields() (of type \"");
      iVar2 = (*(local_80->super_MessageLite)._vptr_MessageLite[0x17])();
      pLVar5 = LogMessage::operator<<(pLVar5,*(string **)(CONCAT44(extraout_var_02,iVar2) + 8));
      pLVar5 = LogMessage::operator<<
                         (pLVar5,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar5 = LogMessage::operator<<(pLVar5,*(string **)(this->descriptor_ + 8));
      pLVar5 = LogMessage::operator<<
                         (pLVar5,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      LogFinisher::operator=((LogFinisher *)&oneof_index,pLVar5);
      LogMessage::~LogMessage((LogMessage *)&swapped_oneof);
    }
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar7 = (ulong)((long)(local_70->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_70->
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar9 = 0;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = uVar9;
    }
    local_78 = this;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      field = (local_70->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar9];
      if (field[0x50] == (FieldDescriptor)0x1) {
        uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        ExtensionSet::SwapExtension
                  ((ExtensionSet *)
                   ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                   (ExtensionSet *)
                   ((long)&(local_80->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                   *(int *)(field + 0x38));
      }
      else {
        lVar1 = *(long *)(field + 0x60);
        if (lVar1 == 0) {
          if (*(int *)(field + 0x4c) != 3) {
            SwapBit(local_78,message1,local_80,field);
          }
          SwapField(local_78,message1,local_80,field);
        }
        else {
          oneof_index = (int)((lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) / 0x30);
          iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&swapped_oneof._M_t,&oneof_index);
          if ((_Rb_tree_header *)iVar6._M_node == &swapped_oneof._M_t._M_impl.super__Rb_tree_header)
          {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &swapped_oneof,&oneof_index);
            SwapOneofField(local_78,message1,local_80,*(OneofDescriptor **)(field + 0x60));
          }
        }
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&swapped_oneof._M_t);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapFields(
    Message* message1,
    Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to SwapFields() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to SwapFields() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2),
          field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}